

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

bool llvm::ARM::getFPUFeatures
               (uint FPUKind,vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features)

{
  pointer *ppSVar1;
  int iVar2;
  iterator iVar3;
  long lVar4;
  StringRef local_28;
  
  if (0x14 < FPUKind - 1) goto LAB_001b34e5;
  lVar4 = (ulong)FPUKind * 0x20;
  iVar2 = *(int *)(&DAT_002145ac + lVar4);
  if (iVar2 == 0) {
    local_28.Data = "-fp-only-sp";
    local_28.Length = 0xb;
    iVar3._M_current =
         (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(Features,iVar3,&local_28);
    }
    else {
      (iVar3._M_current)->Data = "-fp-only-sp";
      (iVar3._M_current)->Length = 0xb;
      ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    local_28.Data = "-d16";
LAB_001b3246:
    local_28.Length = 4;
    iVar3._M_current =
         (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(Features,iVar3,&local_28);
    }
    else {
      (iVar3._M_current)->Data = local_28.Data;
      (iVar3._M_current)->Length = 4;
      ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
  }
  else {
    if (iVar2 == 1) {
      local_28.Data = "-fp-only-sp";
LAB_001b31cf:
      local_28.Length = 0xb;
      iVar3._M_current =
           (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(Features,iVar3,&local_28);
      }
      else {
        (iVar3._M_current)->Data = local_28.Data;
        (iVar3._M_current)->Length = 0xb;
        ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      local_28.Data = "+d16";
      goto LAB_001b3246;
    }
    if (iVar2 == 2) {
      local_28.Data = "+fp-only-sp";
      goto LAB_001b31cf;
    }
  }
  switch(*(undefined4 *)(&DAT_002145a4 + lVar4)) {
  case 0:
    local_28.Data = "-vfp2";
    break;
  case 1:
    local_28.Data = "+vfp2";
    break;
  case 2:
    local_28.Data = "+vfp3";
    goto LAB_001b332f;
  case 3:
    local_28.Data = "+vfp3";
    local_28.Length = 5;
    iVar3._M_current =
         (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(Features,iVar3,&local_28);
    }
    else {
      (iVar3._M_current)->Data = "+vfp3";
      (iVar3._M_current)->Length = 5;
      ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    local_28.Data = "+fp16";
    goto LAB_001b337a;
  case 4:
    local_28.Data = "+vfp4";
    goto LAB_001b33b1;
  case 5:
    local_28.Data = "+fp-armv8";
    goto LAB_001b33e8;
  default:
    goto switchD_001b3292_default;
  }
  local_28.Length = 5;
  iVar3._M_current =
       (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
    _M_realloc_insert<llvm::StringRef>(Features,iVar3,&local_28);
  }
  else {
    (iVar3._M_current)->Data = local_28.Data;
    (iVar3._M_current)->Length = 5;
    ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  local_28.Data = "-vfp3";
LAB_001b332f:
  local_28.Length = 5;
  iVar3._M_current =
       (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
    _M_realloc_insert<llvm::StringRef>(Features,iVar3,&local_28);
  }
  else {
    (iVar3._M_current)->Data = local_28.Data;
    (iVar3._M_current)->Length = 5;
    ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  local_28.Data = "-fp16";
LAB_001b337a:
  local_28.Length = 5;
  iVar3._M_current =
       (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
    _M_realloc_insert<llvm::StringRef>(Features,iVar3,&local_28);
  }
  else {
    (iVar3._M_current)->Data = local_28.Data;
    (iVar3._M_current)->Length = 5;
    ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  local_28.Data = "-vfp4";
LAB_001b33b1:
  local_28.Length = 5;
  iVar3._M_current =
       (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
    _M_realloc_insert<llvm::StringRef>(Features,iVar3,&local_28);
  }
  else {
    (iVar3._M_current)->Data = local_28.Data;
    (iVar3._M_current)->Length = 5;
    ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  local_28.Data = "-fp-armv8";
LAB_001b33e8:
  local_28.Length = 9;
  iVar3._M_current =
       (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
    _M_realloc_insert<llvm::StringRef>(Features,iVar3,&local_28);
  }
  else {
    (iVar3._M_current)->Data = local_28.Data;
    (iVar3._M_current)->Length = 9;
    ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
switchD_001b3292_default:
  iVar2 = *(int *)(&DAT_002145a8 + lVar4);
  if (iVar2 == 0) {
    local_28.Data = "-neon";
LAB_001b346a:
    local_28.Length = 5;
    iVar3._M_current =
         (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(Features,iVar3,&local_28);
    }
    else {
      (iVar3._M_current)->Data = local_28.Data;
      (iVar3._M_current)->Length = 5;
      ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    local_28.Data = "-crypto";
  }
  else {
    if (iVar2 == 1) {
      local_28.Data = "+neon";
      goto LAB_001b346a;
    }
    if (iVar2 != 2) goto LAB_001b34e5;
    local_28.Data = "+neon";
    local_28.Length = 5;
    iVar3._M_current =
         (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(Features,iVar3,&local_28);
    }
    else {
      (iVar3._M_current)->Data = "+neon";
      (iVar3._M_current)->Length = 5;
      ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    local_28.Data = "+crypto";
  }
  local_28.Length = 7;
  iVar3._M_current =
       (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
    _M_realloc_insert<llvm::StringRef>(Features,iVar3,&local_28);
  }
  else {
    (iVar3._M_current)->Data = local_28.Data;
    (iVar3._M_current)->Length = 7;
    ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
LAB_001b34e5:
  return FPUKind - 1 < 0x15;
}

Assistant:

bool llvm::ARM::getFPUFeatures(unsigned FPUKind,
                               std::vector<StringRef> &Features) {

  if (FPUKind >= ARM::FK_LAST || FPUKind == ARM::FK_INVALID)
    return false;

  // fp-only-sp and d16 subtarget features are independent of each other, so we
  // must enable/disable both.
  switch (FPUNames[FPUKind].Restriction) {
  case ARM::FPURestriction::SP_D16:
    Features.push_back("+fp-only-sp");
    Features.push_back("+d16");
    break;
  case ARM::FPURestriction::D16:
    Features.push_back("-fp-only-sp");
    Features.push_back("+d16");
    break;
  case ARM::FPURestriction::None:
    Features.push_back("-fp-only-sp");
    Features.push_back("-d16");
    break;
  }

  // FPU version subtarget features are inclusive of lower-numbered ones, so
  // enable the one corresponding to this version and disable all that are
  // higher. We also have to make sure to disable fp16 when vfp4 is disabled,
  // as +vfp4 implies +fp16 but -vfp4 does not imply -fp16.
  switch (FPUNames[FPUKind].FPUVersion) {
  case ARM::FPUVersion::VFPV5:
    Features.push_back("+fp-armv8");
    break;
  case ARM::FPUVersion::VFPV4:
    Features.push_back("+vfp4");
    Features.push_back("-fp-armv8");
    break;
  case ARM::FPUVersion::VFPV3_FP16:
    Features.push_back("+vfp3");
    Features.push_back("+fp16");
    Features.push_back("-vfp4");
    Features.push_back("-fp-armv8");
    break;
  case ARM::FPUVersion::VFPV3:
    Features.push_back("+vfp3");
    Features.push_back("-fp16");
    Features.push_back("-vfp4");
    Features.push_back("-fp-armv8");
    break;
  case ARM::FPUVersion::VFPV2:
    Features.push_back("+vfp2");
    Features.push_back("-vfp3");
    Features.push_back("-fp16");
    Features.push_back("-vfp4");
    Features.push_back("-fp-armv8");
    break;
  case ARM::FPUVersion::NONE:
    Features.push_back("-vfp2");
    Features.push_back("-vfp3");
    Features.push_back("-fp16");
    Features.push_back("-vfp4");
    Features.push_back("-fp-armv8");
    break;
  }

  // crypto includes neon, so we handle this similarly to FPU version.
  switch (FPUNames[FPUKind].NeonSupport) {
  case ARM::NeonSupportLevel::Crypto:
    Features.push_back("+neon");
    Features.push_back("+crypto");
    break;
  case ARM::NeonSupportLevel::Neon:
    Features.push_back("+neon");
    Features.push_back("-crypto");
    break;
  case ARM::NeonSupportLevel::None:
    Features.push_back("-neon");
    Features.push_back("-crypto");
    break;
  }

  return true;
}